

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int parse_at(envy_bios *bios,envy_bios_p *p,int idx,int offset,char **name)

{
  bool bVar1;
  undefined2 local_6c [4];
  uint32_t tblOffset;
  int ret;
  int entries_count;
  p_known_tables *tbls;
  p_known_tables p2_tbls [1];
  p_known_tables *local_38;
  char **local_30;
  char **name_local;
  int offset_local;
  int idx_local;
  envy_bios_p *p_local;
  envy_bios *bios_local;
  
  tbls._0_1_ = 0;
  p2_tbls[0]._0_8_ = &p->falcon_ucode;
  p2_tbls[0].ptr = (uint16_t *)anon_var_dwarf_5b161;
  if (p->bit->version == '\x01') {
    _ret = &local_38;
    tblOffset = 0;
  }
  else {
    if (p->bit->version != '\x02') {
      return -0x16;
    }
    _ret = &tbls;
    tblOffset = 1;
  }
  if ((idx == -1) || (offset == -1)) {
    name_local._4_4_ = idx;
    if (-1 < offset) {
      name_local._4_4_ = 0;
      while( true ) {
        bVar1 = false;
        if (name_local._4_4_ < (int)tblOffset) {
          bVar1 = (uint)*(byte *)(_ret + (long)name_local._4_4_ * 3) != offset;
        }
        if (!bVar1) break;
        name_local._4_4_ = name_local._4_4_ + 1;
      }
    }
    if ((name_local._4_4_ < 0) || ((int)tblOffset <= name_local._4_4_)) {
      bios_local._4_4_ = -2;
    }
    else if (p->bit->t_len < (ushort)(*(byte *)(_ret + (long)name_local._4_4_ * 3) + 2)) {
      bios_local._4_4_ = -2;
    }
    else {
      if (name != (char **)0x0) {
        *name = (char *)_ret[(long)name_local._4_4_ * 3 + 2];
      }
      local_30 = name;
      name_local._0_4_ = offset;
      _offset_local = p;
      p_local = (envy_bios_p *)bios;
      bios_local._4_4_ =
           bios_u32(bios,(uint)p->bit->t_offset + (uint)*(byte *)(_ret + (long)name_local._4_4_ * 3)
                    ,(uint32_t *)local_6c);
      *(undefined2 *)_ret[(long)name_local._4_4_ * 3 + 1] = local_6c[0];
    }
  }
  else {
    bios_local._4_4_ = -0x16;
  }
  return bios_local._4_4_;
}

Assistant:

static int parse_at(struct envy_bios *bios, struct envy_bios_power *power,
	     int idx, int offset, const char ** name)
{
	struct P_known_tables P1_tbls[] = {
		{ 0x00, &power->perf.offset, "PERFORMANCE" },
		{ 0x04, &power->timing.offset, "MEMORY TIMINGS" },
		{ 0x0c, &power->therm.offset, "THERMAL" },
		{ 0x10, &power->volt.offset, "VOLTAGE" },
		{ 0x15, &power->fan_calib.offset, "NVCLK PERFORMANCE" }
	};
	struct P_known_tables P2_tbls[] = {
		{ 0x00, &power->perf.offset, "PERFORMANCE" },
		{ 0x04, &power->timing_map.offset, "MEMORY TIMINGS MAPPING" },
		{ 0x08, &power->timing.offset, "MEMORY TIMINGS" },
		{ 0x0c, &power->volt.offset, "VOLTAGE" },
		{ 0x10, &power->therm.offset, "THERMAL"  },
		{ 0x14, &power->therm_devices.offset, "THERMAL DEVICES"  },
		{ 0x18, &power->fan_calib.offset, "THERMAL COOLERS" },
		{ 0x1c, &power->unk1c.offset, "PERF SETTINGS SCRIPT" },
		{ 0x20, &power->volt_map.offset, "VOLT MAPPING" },
		{ 0x24, &power->unk24.offset, "VENTURA" },
		{ 0x28, &power->sense.offset, "POWER SENSE" },
		{ 0x2c, &power->budget.offset, "POWER BUDGET" },
		{ 0x30, &power->boost.offset, "BOOST" },
		{ 0x34, &power->cstep.offset, "CSTEP" },
		{ 0x38, &power->base_clock.offset, "POWER BASE CLOCK" },
		{ 0x3c, &power->unk3c.offset, "POWER TOPOLOGY" },
		{ 0x40, &power->unk40.offset, "POWER LEAKAGE" },
		{ 0x44, &power->unk44.offset, "PERF TEST SPEC" },
		{ 0x48, &power->unk48.offset, "THERMAL CHANNEL" },
		{ 0x4c, &power->unk4c.offset, "THERMAL ADJUSTMENT" },
		{ 0x50, &power->unk50.offset, "THERMAL POLICY" },
		{ 0x54, &power->unk54.offset, "PSTATE MEMORY CLK FREQ" },
		{ 0x58, &power->fan.offset, "FAN COOLERS" },
		{ 0x5c, &power->fan_mgmt.offset, "POWER FAN_MGMT" },
		{ 0x60, &power->unk60.offset, "DI/DT" },
		{ 0x64, &power->unk64.offset, "FAN TEST" },
		{ 0x68, &power->unk68.offset, "VOLTAGE RAIL" },
		{ 0x6c, &power->unk6c.offset, "VOLTAGE DEVICE" },
		{ 0x70, &power->unk70.offset, "VOLTAGE POLICY" },
		{ 0x74, &power->unk74.offset, "LOW POWER" },
		{ 0x78, &power->unk78.offset, "LOW POWER PCIe" },
		{ 0x7c, &power->unk7c.offset, "LOW POWER PCIe-PLATFORM" },
		{ 0x80, &power->unk80.offset, "LOW POWER GR" },
		{ 0x84, &power->unk84.offset, "LOW POWER MS" },
		{ 0x88, &power->unk88.offset, "LOW POWER DI" },
		{ 0x8c, &power->unk8c.offset, "LOW POWER GC6" },
		{ 0x90, &power->unk90.offset, "LOW POWER PSI" },
		{ 0x94, &power->unk94.offset, "THERM MONITOR" },
		{ 0x98, &power->unk98.offset, "OVERCLOCKING" },
        /* 0x9c LOW POWER NVLINK */
	};
	struct P_known_tables *tbls;
	int entries_count = 0;
	int ret;

	if (power->bit->version == 0x1) {
		tbls = P1_tbls;
		entries_count = (sizeof(P1_tbls) / sizeof(struct P_known_tables));
	} else if (power->bit->version == 0x2) {
		tbls = P2_tbls;
		entries_count = (sizeof(P2_tbls) / sizeof(struct P_known_tables));
	} else
		return -EINVAL;

	/* either we address by offset or idx */
	if (idx != -1 && offset != -1)
		return -EINVAL;

	/* lookup the index by the table's offset */
	if (offset > -1) {
		idx = 0;
		while (idx < entries_count && tbls[idx].offset != offset)
			idx++;
	}

	/* check the index */
	if (idx < 0 || idx >= entries_count)
		return -ENOENT;

	/* check the table has the right size */
	if (tbls[idx].offset + 2 > power->bit->t_len)
		return -ENOENT;

	if (name)
		*name = tbls[idx].name;

	uint32_t tblOffset;
	ret = bios_u32(bios, power->bit->t_offset + tbls[idx].offset, &tblOffset);
	*tbls[idx].ptr = tblOffset;
	return ret;
}